

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O1

void __thiscall
chrono::ChBody::ContactForceLoadResidual_F
          (ChBody *this,ChVector<double> *F,ChVector<double> *abs_point,ChVectorDynamic<> *R)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double *pdVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ChVector<double> torque1_loc;
  ChVector<double> m_p1_loc;
  double local_58 [4];
  double local_38;
  double local_30;
  double local_28;
  
  ChTransform<double>::TransformParentToLocal
            (abs_point,
             &(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos,
             &(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = F->m_data[0];
  dVar1 = F->m_data[1];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix
                 .super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       dVar1 * *(double *)
                ((long)&(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                        Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                0x18);
  auVar2 = vfmadd231sd_fma(auVar16,auVar11,auVar2);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = F->m_data[2];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(double *)
                  ((long)&(this->super_ChBodyFrame).super_ChFrameMoving<double>.
                          super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                  0x30);
  auVar2 = vfmadd231sd_fma(auVar2,auVar17,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(double *)
                  ((long)&(this->super_ChBodyFrame).super_ChFrameMoving<double>.
                          super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage + 8
                  );
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       dVar1 * *(double *)
                ((long)&(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                        Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                0x20);
  auVar3 = vfmadd231sd_fma(auVar19,auVar11,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(double *)
                  ((long)&(this->super_ChBodyFrame).super_ChFrameMoving<double>.
                          super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                  0x38);
  auVar3 = vfmadd231sd_fma(auVar3,auVar17,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(double *)
                  ((long)&(this->super_ChBodyFrame).super_ChFrameMoving<double>.
                          super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                  0x10);
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       dVar1 * *(double *)
                ((long)&(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                        Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                0x28);
  auVar4 = vfmadd231sd_fma(auVar14,auVar11,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(double *)
                  ((long)&(this->super_ChBodyFrame).super_ChFrameMoving<double>.
                          super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                  0x40);
  auVar4 = vfmadd231sd_fma(auVar4,auVar17,auVar7);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_30;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_28;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = auVar3._0_8_ * local_28;
  auVar5 = vfmsub231sd_fma(auVar20,auVar12,auVar4);
  local_58[0] = auVar5._0_8_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_38;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = auVar4._0_8_ * local_38;
  auVar4 = vfmsub231sd_fma(auVar15,auVar2,auVar18);
  local_58[1] = (double)auVar4._0_8_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = auVar2._0_8_ * local_30;
  auVar2 = vfmsub231sd_fma(auVar13,auVar21,auVar3);
  local_58[2] = (double)auVar2._0_8_;
  uVar9 = (ulong)(this->super_ChPhysicsItem).offset_w;
  if ((long)uVar9 <=
      (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3) {
    pdVar8 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
             uVar9;
    uVar9 = 3;
    if ((((ulong)pdVar8 & 7) == 0) &&
       (uVar10 = (ulong)(-((uint)((ulong)pdVar8 >> 3) & 0x1fffffff) & 7), uVar10 < 3)) {
      uVar9 = uVar10;
    }
    if (uVar9 != 0) {
      uVar10 = 0;
      do {
        pdVar8[uVar10] = F->m_data[uVar10] + pdVar8[uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
    }
    if (uVar9 < 3) {
      do {
        pdVar8[uVar9] = F->m_data[uVar9] + pdVar8[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar9 != 3);
    }
    uVar9 = (ulong)((this->super_ChPhysicsItem).offset_w + 3);
    if ((long)uVar9 <=
        (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3) {
      pdVar8 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               + uVar9;
      uVar9 = 3;
      if ((((ulong)pdVar8 & 7) == 0) &&
         (uVar10 = (ulong)(-((uint)((ulong)pdVar8 >> 3) & 0x1fffffff) & 7), uVar10 < 3)) {
        uVar9 = uVar10;
      }
      if (uVar9 != 0) {
        uVar10 = 0;
        do {
          pdVar8[uVar10] = local_58[uVar10] + pdVar8[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
      if (uVar9 < 3) {
        do {
          pdVar8[uVar9] = local_58[uVar9] + pdVar8[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar9 != 3);
      }
      return;
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChBody::ContactForceLoadResidual_F(const ChVector<>& F, const ChVector<>& abs_point, ChVectorDynamic<>& R) {
    ChVector<> m_p1_loc = this->Point_World2Body(abs_point);
    ChVector<> force1_loc = this->Dir_World2Body(F);
    ChVector<> torque1_loc = Vcross(m_p1_loc, force1_loc);
    R.segment(this->GetOffset_w() + 0, 3) += F.eigen();
    R.segment(this->GetOffset_w() + 3, 3) += torque1_loc.eigen();
}